

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O0

int net_tcp4_bind(int s,uchar *ip,unsigned_short port)

{
  int iVar1;
  uchar *ptr;
  undefined4 local_28;
  sockaddr_in sa;
  unsigned_short port_local;
  uchar *ip_local;
  int s_local;
  
  sa.sin_zero._2_2_ = port;
  unique0x10000068 = ip;
  memset((void *)((long)&ptr + 4),0,0x10);
  ptr._4_2_ = 2;
  ptr._6_1_ = sa.sin_zero[3];
  ptr._7_1_ = sa.sin_zero[2];
  local_28 = *(undefined4 *)stack0xffffffffffffffe8;
  iVar1 = bind(s,(sockaddr *)((long)&ptr + 4),0x10);
  return iVar1;
}

Assistant:

int net_tcp4_bind(int s, unsigned char ip[4], unsigned short port) {
  struct sockaddr_in sa;

  memset(&sa, 0, sizeof(sa));

  sa.sin_family = AF_INET;

  unsigned char *ptr = (unsigned char *)&sa.sin_port;
  UINT16_PACK(ptr, port);
  memcpy(&sa.sin_addr, ip, 4);
  
  return bind(s, (struct sockaddr *)&sa, sizeof(sa));
}